

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

shared_ptr<mocker::ir::Addr> __thiscall
mocker::ir::Builder::translateNewArray
          (Builder *this,shared_ptr<mocker::ast::Type> *rawCurType,
          queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
          *sizeProvided)

{
  _Map_pointer ppsVar1;
  _Elt_pointer psVar2;
  string *psVar3;
  BuilderContext *pBVar4;
  _Elt_pointer psVar5;
  _List_node_base *p_Var6;
  undefined8 uVar7;
  bool bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar9;
  BBLIter BVar10;
  BBLIter iter;
  deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar13 [16];
  shared_ptr<mocker::ir::Addr> sVar14;
  shared_ptr<mocker::ir::Reg> arrayInstPtr;
  shared_ptr<mocker::ast::Type> elementType;
  shared_ptr<mocker::ir::Reg> memPtr;
  shared_ptr<mocker::ir::Reg> curElementPtrPtr;
  shared_ptr<mocker::ir::Jump> jump2condition;
  shared_ptr<mocker::ir::Reg> curElementPtr;
  shared_ptr<mocker::ir::Label> successorLabel;
  shared_ptr<mocker::ir::Label> bodyLabel;
  shared_ptr<mocker::ir::Label> conditionLabel;
  shared_ptr<mocker::ir::Reg> contentEndPtr;
  shared_ptr<mocker::ir::Reg> contentLen;
  value_type size;
  shared_ptr<mocker::ir::Reg> nextElementPtr;
  shared_ptr<mocker::ir::Addr> elementInstPtr;
  shared_ptr<mocker::ir::Reg> cmpRes;
  shared_ptr<mocker::ir::Reg> memLen;
  shared_ptr<mocker::ir::Addr> local_1b0;
  element_type local_1a0 [2];
  undefined1 local_190 [24];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  OpType local_134;
  undefined1 local_130 [24];
  shared_ptr<mocker::ir::Label> local_118;
  shared_ptr<mocker::ir::Label> local_108;
  shared_ptr<mocker::ir::Label> local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  __node_base local_c0;
  shared_ptr<mocker::ir::IRInst> local_b8;
  undefined1 local_a8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  undefined1 local_88 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined1 local_68 [48];
  __node_base _Stack_38;
  
  local_190._16_8_ =
       (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi[0x29]._vptr__Sp_counted_base;
  ppsVar1 = (sizeProvided->c).
            super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Deque_impl_data._M_map;
  if (ppsVar1 == (_Map_pointer)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = __dynamic_cast(ppsVar1,&ast::Type::typeinfo,&ast::ArrayType::typeinfo,0);
  }
  if (lVar9 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar9 = 0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (sizeProvided->c).
              super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  if (lVar9 == 0) {
    __assert_fail("curType",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                  ,0x2d1,
                  "std::shared_ptr<Addr> mocker::ir::Builder::translateNewArray(const std::shared_ptr<ast::Type> &, std::queue<std::shared_ptr<Addr>> &) const"
                 );
  }
  local_178._0_8_ = *(long *)(lVar9 + 0x18);
  local_178._8_8_ = *(long *)(lVar9 + 0x20);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_)->_M_use_count + 1;
    }
  }
  psVar2 = (in_RCX->
           super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_d8._16_8_ =
       (psVar2->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c0._M_nxt =
       (_Hash_node_base *)
       (psVar2->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_nxt)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_nxt)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_nxt)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_nxt)->_M_use_count + 1;
    }
  }
  std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  ::pop_front(in_RCX);
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"memLen","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_68,psVar3);
  if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1a0
     ) {
    operator_delete(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1a0[0]._vptr_Addr + 1);
  }
  BuilderContext::emplaceInst<mocker::ir::AttachedComment,char_const(&)[28]>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(char (*) [28])"Calculate the memory needed");
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"contentLen","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_d8,psVar3);
  if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1a0
     ) {
    operator_delete(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1a0[0]._vptr_Addr + 1);
  }
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_168._0_4_ = Mul;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 8;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>&>
            (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_d8,(OpType *)local_168,&local_1b0,
             (shared_ptr<mocker::ir::Addr> *)(local_d8 + 0x10));
  if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_168._0_4_ = Add;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 8;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
            (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_68,(OpType *)local_168,
             (shared_ptr<mocker::ir::Reg> *)local_d8,&local_1b0);
  if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"memPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_168,psVar3);
  if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1a0
     ) {
    operator_delete(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1a0[0]._vptr_Addr + 1);
  }
  BuilderContext::
  emplaceInst<mocker::ir::Malloc,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_168,
             (shared_ptr<mocker::ir::Reg> *)local_68);
  psVar3 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"arrayInstPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_190,psVar3);
  if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1a0
     ) {
    operator_delete(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_1a0[0]._vptr_Addr + 1);
  }
  pBVar4 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_158._0_4_ = Add;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 8;
  local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
            (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_190,(OpType *)local_158,
             (shared_ptr<mocker::ir::Reg> *)local_168,&local_1b0);
  if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BuilderContext::
  emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_168,
             (shared_ptr<mocker::ir::Addr> *)(local_d8 + 0x10));
  bVar8 = isIntTy((Builder *)rawCurType,(shared_ptr<mocker::ast::Type> *)local_178);
  _Var11._M_pi = extraout_RDX;
  if (!bVar8) {
    bVar8 = isBoolTy((Builder *)rawCurType,(shared_ptr<mocker::ast::Type> *)local_178);
    _Var11._M_pi = extraout_RDX_00;
    if (!bVar8) {
      if ((element_type *)local_178._0_8_ == (element_type *)0x0) {
        bVar8 = true;
      }
      else {
        auVar13 = __dynamic_cast(local_178._0_8_,&ast::Type::typeinfo,&ast::ArrayType::typeinfo,0);
        _Var11._M_pi = auVar13._8_8_;
        bVar8 = auVar13._0_8_ == 0;
      }
      if (bVar8) {
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_178._8_8_ + 8) = *(_Atomic_word *)(local_178._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_178._8_8_ + 8) = *(_Atomic_word *)(local_178._8_8_ + 8) + 1;
          }
        }
      }
      if (bVar8) {
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
        }
      }
      else {
        psVar2 = (in_RCX->
                 super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar5 = (in_RCX->
                 super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 )._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          _Var11._M_pi = extraout_RDX_01;
        }
        if (psVar5 == psVar2) goto LAB_00140a18;
      }
      BuilderContext::emplaceInst<mocker::ir::Comment,char_const(&)[26]>
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(char (*) [26])"init the content of array");
      local_130._16_8_ = operator_new(0x20);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_base_001f1290;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_130._16_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)rawCurType;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_130._16_8_ + 0x10))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_130._16_8_ + 0x10))->_M_weak_count = 0
      ;
      psVar3 = (string *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"curElementPtrPtr","");
      BuilderContext::makeTempLocalReg((BuilderContext *)local_158,psVar3);
      local_68._32_8_ = this;
      if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          local_1a0) {
        operator_delete(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(long)local_1a0[0]._vptr_Addr + 1);
      }
      pBVar4 = (BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      BVar10._M_node = ((_List_node_base *)(local_190._16_8_ + 0x30))->_M_prev;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
                (&local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(Alloca **)&local_1b0,(allocator<mocker::ir::Alloca> *)local_e8,
                 (shared_ptr<mocker::ir::Reg> *)local_158);
      local_68._40_8_ =
           local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Stack_38._M_nxt =
           (_Hash_node_base *)
           local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      BuilderContext::appendInstFront
                (pBVar4,BVar10,(shared_ptr<mocker::ir::IRInst> *)(local_68 + 0x28));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_38._M_nxt !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_38._M_nxt);
      }
      if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BuilderContext::
      emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_158,
                 (shared_ptr<mocker::ir::Reg> *)local_190);
      psVar3 = (string *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"contentEndPtr","");
      BuilderContext::makeTempLocalReg((BuilderContext *)local_e8,psVar3);
      if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          local_1a0) {
        operator_delete(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(long)local_1a0[0]._vptr_Addr + 1);
      }
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_,5);
      BuilderContext::
      emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_e8,(OpType *)&local_1b0,
                 (shared_ptr<mocker::ir::Reg> *)local_190,(shared_ptr<mocker::ir::Reg> *)local_d8);
      BVar10 = BuilderContext::getCurBasicBlock
                         ((BuilderContext *)
                          (rawCurType->
                          super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi);
      BVar10 = FunctionModule::insertBBAfter((FunctionModule *)local_190._16_8_,BVar10);
      p_Var6 = BVar10._M_node[1]._M_next;
      local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      (local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count = 1;
      (local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_weak_count = 1;
      (local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
      local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
      local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
      *(_List_node_base **)
       &local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._M_use_count = p_Var6;
      iter = FunctionModule::insertBBAfter((FunctionModule *)local_190._16_8_,BVar10);
      p_Var6 = iter._M_node[1]._M_next;
      local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      uVar7 = local_190._16_8_;
      (local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count = 1;
      (local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_weak_count = 1;
      (local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
      local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
      local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
      *(_List_node_base **)
       &local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_use_count = p_Var6;
      local_190._16_8_ = iter;
      local_68._16_8_ = FunctionModule::insertBBAfter((FunctionModule *)uVar7,iter);
      p_Var6 = ((_List_node_base *)(local_68._16_8_ + 0x10))->_M_next;
      local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      (local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count = 1;
      (local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_weak_count = 1;
      (local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
      local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
      local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
      *(_List_node_base **)
       &local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_use_count = p_Var6;
      local_158._16_8_ = (_List_node_base *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Jump,std::allocator<mocker::ir::Jump>,std::shared_ptr<mocker::ir::Label>&>
                (&local_140,(Jump **)(local_158 + 0x10),(allocator<mocker::ir::Jump> *)&local_1b0,
                 &local_f8);
      this = (Builder *)local_68._32_8_;
      pBVar4 = (BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      local_88._16_8_ = local_158._16_8_;
      local_70 = local_140._M_pi;
      if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_140._M_pi)->_M_use_count = (local_140._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_140._M_pi)->_M_use_count = (local_140._M_pi)->_M_use_count + 1;
        }
      }
      BuilderContext::appendInst(pBVar4,(shared_ptr<mocker::ir::IRInst> *)(local_88 + 0x10));
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
      BuilderContext::setCurBasicBlock
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,BVar10);
      psVar3 = (string *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"curElementPtr","");
      BuilderContext::makeTempLocalReg((BuilderContext *)local_130,psVar3);
      if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          local_1a0) {
        operator_delete(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(long)local_1a0[0]._vptr_Addr + 1);
      }
      BuilderContext::
      emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_130,
                 (shared_ptr<mocker::ir::Reg> *)local_158);
      psVar3 = (string *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"cmpRes","");
      BuilderContext::makeTempLocalReg((BuilderContext *)local_88,psVar3);
      if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          local_1a0) {
        operator_delete(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(long)local_1a0[0]._vptr_Addr + 1);
      }
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_,1);
      BuilderContext::
      emplaceInst<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::RelationInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_88,(OpType *)&local_1b0,
                 (shared_ptr<mocker::ir::Reg> *)local_130,(shared_ptr<mocker::ir::Reg> *)local_e8);
      BuilderContext::
      emplaceInst<mocker::ir::Branch,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Label>&,std::shared_ptr<mocker::ir::Label>&>
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_88,&local_108,&local_118);
      BuilderContext::setCurBasicBlock
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(BBLIter)local_190._16_8_);
      if ((element_type *)local_178._0_8_ == (element_type *)0x0) {
        bVar8 = true;
      }
      else {
        lVar9 = __dynamic_cast(local_178._0_8_,&ast::Type::typeinfo,&ast::ArrayType::typeinfo,0);
        bVar8 = lVar9 == 0;
      }
      if (bVar8) {
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_178._8_8_ + 8) = *(_Atomic_word *)(local_178._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_178._8_8_ + 8) = *(_Atomic_word *)(local_178._8_8_ + 8) + 1;
          }
        }
      }
      if (bVar8) {
        makeNewNonarray((Builder *)(local_a8 + 0x10),rawCurType);
      }
      else {
        translateNewArray((Builder *)(local_a8 + 0x10),rawCurType,
                          (queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                           *)local_178);
      }
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      BuilderContext::
      emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_130,
                 (shared_ptr<mocker::ir::Addr> *)(local_a8 + 0x10));
      psVar3 = (string *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"nextElementPtr","");
      BuilderContext::makeTempLocalReg((BuilderContext *)local_a8,psVar3);
      if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          local_1a0) {
        operator_delete(local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(long)local_1a0[0]._vptr_Addr + 1);
      }
      pBVar4 = (BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      local_134 = Add;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count = 1;
      (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_weak_count = 1;
      (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_use_count = 8;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [1]._M_weak_count = 0;
      BuilderContext::
      emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
                (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_a8,&local_134,
                 (shared_ptr<mocker::ir::Reg> *)local_130,&local_1b0);
      if (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BuilderContext::
      emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(shared_ptr<mocker::ir::Reg> *)local_158,
                 (shared_ptr<mocker::ir::Reg> *)local_a8);
      pBVar4 = (BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      local_b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_158._16_8_;
      local_b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = local_140._M_pi;
      if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_140._M_pi)->_M_use_count = (local_140._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_140._M_pi)->_M_use_count = (local_140._M_pi)->_M_use_count + 1;
        }
      }
      BuilderContext::appendInst(pBVar4,&local_b8);
      if (local_b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BuilderContext::setCurBasicBlock
                ((BuilderContext *)
                 (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(BBLIter)local_68._16_8_);
      uVar7 = local_190._8_8_;
      ((__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> *)this)->_M_ptr =
           (element_type *)local_190._0_8_;
      (((__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> *)this)->_M_refcount)._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_190._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (((__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> *)this)->_M_refcount)._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      local_190._0_8_ = (element_type *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
      }
      if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
      }
      if (local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_);
      _Var11._M_pi = extraout_RDX_02;
      goto LAB_00141236;
    }
  }
LAB_00140a18:
  uVar7 = local_190._8_8_;
  *(undefined8 *)this = local_190._0_8_;
  this->ctx = (BuilderContext *)0x0;
  local_190._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ctx = (BuilderContext *)uVar7;
  local_190._0_8_ = (element_type *)0x0;
LAB_00141236:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
    _Var11._M_pi = extraout_RDX_03;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    _Var11._M_pi = extraout_RDX_04;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    _Var11._M_pi = extraout_RDX_05;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    _Var11._M_pi = extraout_RDX_06;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_nxt);
    _Var11._M_pi = extraout_RDX_07;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
    _Var11._M_pi = extraout_RDX_08;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var11._M_pi = extraout_RDX_09;
  }
  sVar14.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  sVar14.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Addr>)
         sVar14.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr> Builder::translateNewArray(
    const std::shared_ptr<ast::Type> &rawCurType,
    std::queue<std::shared_ptr<Addr>> &sizeProvided) const {
  // We describe the translation of statements "new T[N]" here. First, note that
  // the result is a pointer arrayInstPtr, which points to the address of the
  // first element of the array. (The length of the array is store in front of
  // the array elements.) It is the return value of this function. Hence, the
  // first step is
  //   1. to malloc a piece of memory of length 8 + 8 * N and store the address
  //      + 8 into arrayInstPtr;
  //   2. and store N into the first 8 bytes.
  // Then, we shall construct the array. If T is int or bool, then there is
  // nothing to do. Otherwise, we shall construct each element via a loop. To
  // implement the loop, we first need aa temporary variable to store the
  // address of the current element since our registers are of SSA form, that
  // is, they can not be assigned more than once. Namely, we shall
  //   3. alloca a piece of memory for the temporary varaible and store the
  //      address into the register curElementPtrPtr. And store the address of
  //      the head, namely, the contentPtr, into the address stored in
  //      curElementPtrPtr. (Meanwhile, we shall compute the address of the
  //      end of the array for later use.)
  // After finishing the routine of creating basic blocks and labels, we
  // construct the condition for the loop to end.
  //   4. Load curElementPtr from the address stored in curElementPtrPtr.
  //   5. Compare it with the end pointer and jump according to the result.
  // Now we implement the body of the loop. In fact, what we need to do is just
  // initializing the current element.
  //   6. New an element. (See next section for details.)
  //   7. Store the address into the current element.
  //   8. Update the loop variable and jump back to the condition basic block.
  //
  // In this passage, we handle some details. First, we need to support newing
  // a jagged array. To achieve this, we let this function to be recursive, that
  // is, in step 6., if the type of the element is still array, then, instead of
  // newing an element, we call this function recursively and pass down the
  // remaining provided sizes.
  // Note that the number of sizes provided may be less than the dimension of
  // the array. This case is similar to the int/bool case. We just return after
  // step 2., leaving the elements uninitialized.

  auto &func = ctx.getCurFunc();
  auto curType = std::dynamic_pointer_cast<ast::ArrayType>(rawCurType);
  assert(curType);
  auto elementType = curType->baseType;

  // 1.
  auto size = sizeProvided.front();
  sizeProvided.pop();
  auto memLen = ctx.makeTempLocalReg("memLen");
  ctx.emplaceInst<AttachedComment>("Calculate the memory needed");
  auto contentLen = ctx.makeTempLocalReg("contentLen");
  ctx.emplaceInst<ArithBinaryInst>(contentLen, ArithBinaryInst::Mul,
                                   makeILit(8),
                                   size); // calcMemLen
  ctx.emplaceInst<ArithBinaryInst>(memLen, ArithBinaryInst::Add, contentLen,
                                   makeILit(8));
  auto memPtr = ctx.makeTempLocalReg("memPtr");
  ctx.emplaceInst<Malloc>(memPtr, memLen);

  auto arrayInstPtr = ctx.makeTempLocalReg("arrayInstPtr");
  ctx.emplaceInst<ArithBinaryInst>(arrayInstPtr, ArithBinaryInst::Add, memPtr,
                                   makeILit(8));

  // 2.
  ctx.emplaceInst<Store>(memPtr, size);

  // 3.
  if (isIntTy(elementType) || isBoolTy(elementType))
    return arrayInstPtr;
  if ((bool)std::dynamic_pointer_cast<ast::ArrayType>(elementType) &&
      sizeProvided.empty())
    return arrayInstPtr;

  ctx.emplaceInst<Comment>("init the content of array");
  auto defer = std::shared_ptr<void *>(
      nullptr, [this](void *) { ctx.emplaceInst<Comment>(""); });

  auto curElementPtrPtr = ctx.makeTempLocalReg("curElementPtrPtr");
  ctx.appendInstFront(func.getFirstBB(),
                      std::make_shared<Alloca>(curElementPtrPtr));
  ctx.emplaceInst<Store>(curElementPtrPtr, arrayInstPtr);
  auto contentEndPtr = ctx.makeTempLocalReg("contentEndPtr");
  // calcContentEndPtr
  ctx.emplaceInst<ArithBinaryInst>(contentEndPtr, ArithBinaryInst::Add,
                                   arrayInstPtr, contentLen);

  auto originBB = ctx.getCurBasicBlock();
  auto conditionFirstBB = func.insertBBAfter(originBB);
  auto conditionLabel = getBBLabel(conditionFirstBB);
  auto bodyFirstBB = func.insertBBAfter(conditionFirstBB);
  auto bodyLabel = getBBLabel(bodyFirstBB);
  auto successorBB = func.insertBBAfter(bodyFirstBB);
  auto successorLabel = getBBLabel(successorBB);

  auto jump2condition = std::make_shared<Jump>(conditionLabel);
  ctx.appendInst(jump2condition);

  // 4.
  ctx.setCurBasicBlock(conditionFirstBB);
  auto curElementPtr = ctx.makeTempLocalReg("curElementPtr");
  ctx.emplaceInst<Load>(curElementPtr, curElementPtrPtr);
  // 5.
  auto cmpRes = ctx.makeTempLocalReg("cmpRes");
  ctx.emplaceInst<RelationInst>(cmpRes, RelationInst::Ne, curElementPtr,
                                contentEndPtr);
  ctx.emplaceInst<Branch>(cmpRes, bodyLabel, successorLabel);

  // 6.
  ctx.setCurBasicBlock(bodyFirstBB);
  auto elementInstPtr =
      (bool)std::dynamic_pointer_cast<ast::ArrayType>(elementType)
          ? translateNewArray(elementType, sizeProvided)
          : makeNewNonarray(elementType);
  // 7.
  ctx.emplaceInst<Store>(curElementPtr, elementInstPtr);
  // 8.
  auto nextElementPtr = ctx.makeTempLocalReg("nextElementPtr");
  ctx.emplaceInst<ArithBinaryInst>(nextElementPtr, ArithBinaryInst::Add,
                                   curElementPtr,
                                   makeILit(8)); // calcNextElementPtr
  ctx.emplaceInst<Store>(curElementPtrPtr, nextElementPtr);
  ctx.appendInst(jump2condition);

  ctx.setCurBasicBlock(successorBB);
  return arrayInstPtr;
}